

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
          (Attribute *this,double t,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_60;
  optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_> local_48;
  
  if (dst == (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0) {
    return false;
  }
  if ((NAN(t)) &&
     ((((this->_var)._blocked != false ||
       (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0)) ||
      ((uVar3 = (*pvVar1->type_id)(), uVar3 != 0 &&
       ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
        (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))))) {
    primvar::PrimVar::
    get_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
              (&local_48,&this->_var);
    if (local_48.has_value_ != false) {
      local_60.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_48.contained.data._0_8_;
      local_60.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48.contained._8_8_;
      local_60.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48.contained._16_8_;
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator=
                (dst,&local_60);
    }
    if (((local_48.has_value_ & 1U) != 0) &&
       ((anon_struct_8_0_00000001_for___align)
        local_60.
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0)) {
      operator_delete(local_60.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.has_value_ != false) {
      return true;
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                      (this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::
            get_interpolated_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }